

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O3

int * __thiscall
dnet::data_types::tensor<int,_3U>::operator[](tensor<int,_3U> *this,array<unsigned_int,_3UL> *i)

{
  size_t t;
  long lVar1;
  exception *__return_storage_ptr__;
  int ret;
  int iVar2;
  axes_type ii;
  uint local_74 [3];
  string local_68;
  string local_48;
  
  lVar1 = 0;
  do {
    local_74[(this->_axes_sort)._M_elems[lVar1]] = i->_M_elems[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (((i->_M_elems[0] < (this->_shape)._M_elems[0]) &&
      (i->_M_elems[1] < (this->_shape)._M_elems[1])) &&
     (i->_M_elems[2] < (this->_shape)._M_elems[2])) {
    lVar1 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (this->_facts)._M_elems[lVar1] * local_74[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    return (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + iVar2;
  }
  __return_storage_ptr__ = (exception *)__cxa_allocate_exception(0x40);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"matrix","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Index out of range.","");
  misc::make_error(__return_storage_ptr__,&local_68,&local_48);
  __cxa_throw(__return_storage_ptr__,&misc::exception::typeinfo,misc::exception::~exception);
}

Assistant:

T &tensor<T, N>::operator[](const std::array<index_type, N> &i)
        {
            axes_type ii;
            for (size_t t = 0; t < i.size(); t++)
                ii[this->_axes_sort[t]] = i[t];
            if (!this->check(i)) {
                throw misc::make_error("matrix", "Index out of range.");
            }
            return this->_data[this->to_index(ii)];
        }